

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>::do_line
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this,
          sample_type *param_1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  sample_type sVar4;
  int32_t iVar5;
  int32_t q2;
  int32_t q3;
  int32_t iVar6;
  int32_t qs;
  int32_t rc;
  int32_t ra;
  int32_t rd;
  int32_t rb;
  int32_t index;
  sample_type *param_1_local;
  jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this_local;
  
  rd = 0;
  ra = (int32_t)this->previous_line_[-1];
  rc = (uint)*this->previous_line_;
  while (iVar6 = ra, (uint)rd < this->width_) {
    uVar1 = this->current_line_[rd + -1];
    ra = rc;
    uVar2 = this->previous_line_[rd + 1];
    iVar5 = quantize_gradient(this,(uint)uVar2 - rc);
    q2 = quantize_gradient(this,rc - iVar6);
    q3 = quantize_gradient(this,iVar6 - (uint)uVar1);
    iVar5 = compute_context_id(iVar5,q2,q3);
    if (iVar5 == 0) {
      iVar6 = do_run_mode(this,rd,(decoder_strategy *)0x0);
      rd = iVar6 + rd;
      ra = (int32_t)this->previous_line_[rd + -1];
      rc = (int32_t)this->previous_line_[rd];
    }
    else {
      uVar3 = this->current_line_[rd];
      iVar6 = get_predicted_value((uint)uVar1,rc,iVar6);
      sVar4 = do_regular(this,iVar5,(uint)uVar3,iVar6,(decoder_strategy *)0x0);
      this->current_line_[rd] = sVar4;
      rd = rd + 1;
      rc = (uint)uVar2;
    }
  }
  return;
}

Assistant:

FORCE_INLINE void do_line(sample_type* /*template_selector*/)
    {
        int32_t index{};
        int32_t rb{previous_line_[index - 1]};
        int32_t rd{previous_line_[index]};

        while (static_cast<uint32_t>(index) < width_)
        {
            const int32_t ra{current_line_[index - 1]};
            const int32_t rc{rb};
            rb = rd;
            rd = previous_line_[index + 1];

            const int32_t qs{
                compute_context_id(quantize_gradient(rd - rb), quantize_gradient(rb - rc), quantize_gradient(rc - ra))};

            if (qs != 0)
            {
                current_line_[index] =
                    do_regular(qs, current_line_[index], get_predicted_value(ra, rb, rc), static_cast<Strategy*>(nullptr));
                ++index;
            }
            else
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
                rb = previous_line_[index - 1];
                rd = previous_line_[index];
            }
        }
    }